

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O2

char * get_remote_username(Conf *conf)

{
  _Bool _Var1;
  char *pcVar2;
  
  pcVar2 = conf_get_str(conf,0x39);
  if (*pcVar2 != '\0') {
    pcVar2 = dupstr(pcVar2);
    return pcVar2;
  }
  _Var1 = conf_get_bool(conf,0x3a);
  if (_Var1) {
    pcVar2 = get_username();
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *get_remote_username(Conf *conf)
{
    char *username = conf_get_str(conf, CONF_username);
    if (*username) {
        return dupstr(username);
    } else if (conf_get_bool(conf, CONF_username_from_env)) {
        /* Use local username. */
        return get_username();     /* might still be NULL */
    } else {
        return NULL;
    }
}